

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkInvertConstraints(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  ulong uVar4;
  
  if (pNtk->nConstrs != 0) {
    pVVar2 = pNtk->vPos;
    uVar4 = (ulong)(uint)pVVar2->nSize;
    if (0 < pVVar2->nSize) {
      lVar3 = 0;
      do {
        if ((long)(int)uVar4 - (long)pNtk->nConstrs <= lVar3) {
          puVar1 = (uint *)((long)pVVar2->pArray[lVar3] + 0x14);
          *puVar1 = *puVar1 ^ 0x400;
          pVVar2 = pNtk->vPos;
        }
        lVar3 = lVar3 + 1;
        uVar4 = (ulong)pVVar2->nSize;
      } while (lVar3 < (long)uVar4);
    }
  }
  return;
}

Assistant:

void Abc_NtkInvertConstraints( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    if ( Abc_NtkConstrNum(pNtk) == 0 )
        return;
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
            Abc_ObjXorFaninC( pObj, 0 );
    }
}